

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringCompareMethod::StringCompareMethod
          (StringCompareMethod *this,Compilation *comp,string *name,bool ignoreCase)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_51;
  Type *local_50;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  
  local_50 = comp->stringType;
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,__l,&local_51);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,comp->intType,true,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_48);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_004770c0;
  (this->super_SimpleSystemSubroutine).field_0x62 = ignoreCase;
  return;
}

Assistant:

StringCompareMethod(Compilation& comp, const std::string& name, bool ignoreCase) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getStringType()},
                               comp.getIntType(), true),
        ignoreCase(ignoreCase) {}